

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

string * __thiscall
soul::heart::Printer::PrinterStream::getBlockName_abi_cxx11_
          (string *__return_storage_ptr__,PrinterStream *this,Block *b)

{
  long *plVar1;
  
  plVar1 = (long *)(this->localVariableNames)._M_h._M_bucket_count;
  if (plVar1 != (long *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar1,plVar1[1] + *plVar1);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("isValid()","operator const std::basic_string<char> &",0x21);
}

Assistant:

static std::string getDump (const Program& p)
    {
        choc::text::CodePrinter out;
        print (p, out);
        return out.toString();
    }